

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O3

void __thiscall
SuiteTimeRangeTests::TestisInRangeWithDay_SameDay::~TestisInRangeWithDay_SameDay
          (TestisInRangeWithDay_SameDay *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(isInRangeWithDay_SameDay)
{
  UtcTimeOnly startTime( 3, 0, 0 );
  UtcTimeOnly endTime( 18, 0, 0 );
  int startDay = 2;
  int endDay = 2;

  UtcTimeStamp now( 2, 0, 0, 28, 7, 2004 );
  TimeRange timeRange(startTime, endTime, startDay, endDay);
  CHECK(TimeRange::isInRange(startTime, endTime, startDay, endDay, now));
}